

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlElementHandler.cpp
# Opt level: O0

void __thiscall
TestXmlElementHandler::endHeader(TestXmlElementHandler *this,Header *header,QDomElement *xmlElement)

{
  bool bVar1;
  undefined1 auVar2 [12];
  QString local_60;
  undefined4 local_44;
  undefined8 local_40;
  QString local_38;
  QDomElement *local_20;
  QDomElement *xmlElement_local;
  Header *header_local;
  TestXmlElementHandler *this_local;
  
  local_20 = xmlElement;
  xmlElement_local = (QDomElement *)header;
  header_local = (Header *)this;
  QDomElement::tagName();
  bVar1 = QString::operator==(&local_38,"header");
  if (!bVar1) {
    auVar2 = qt_assert("xmlElement.tagName() == \"header\"",
                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/TestXmlElementHandler.cpp"
                       ,0x35);
    local_44 = auVar2._8_4_;
    local_40 = auVar2._0_8_;
    QString::~QString(&local_38);
    _Unwind_Resume(local_40);
  }
  QString::~QString(&local_38);
  QString::QString(&local_60,"endHeader");
  QList<QString>::operator<<(&this->cb,&local_60);
  QString::~QString(&local_60);
  return;
}

Assistant:

void TestXmlElementHandler::endHeader(KDReports::Header &header, const QDomElement &xmlElement)
{
    Q_UNUSED(header);
    Q_UNUSED(xmlElement); // unused in release mode
    Q_ASSERT(xmlElement.tagName() == "header");
    cb << "endHeader";
}